

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGParameters.h
# Opt level: O3

bool __thiscall
dg::DGParameters<dg::LLVMNode>::add
          (DGParameters<dg::LLVMNode> *this,KeyT k,LLVMNode *val_in,LLVMNode *val_out,
          ContainerType *C)

{
  size_t *psVar1;
  BBlock<dg::LLVMNode> *pBVar2;
  _List_node_base *p_Var3;
  pair<std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>,_bool>
  pVar4;
  pair<llvm::Value_*,_dg::DGParameterPair<dg::LLVMNode>_> local_48;
  
  local_48.first = k;
  local_48.second.in = val_in;
  local_48.second.out = val_out;
  pVar4 = std::
          _Rb_tree<llvm::Value*,std::pair<llvm::Value*const,dg::DGParameterPair<dg::LLVMNode>>,std::_Select1st<std::pair<llvm::Value*const,dg::DGParameterPair<dg::LLVMNode>>>,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::DGParameterPair<dg::LLVMNode>>>>
          ::_M_emplace_unique<std::pair<llvm::Value*,dg::DGParameterPair<dg::LLVMNode>>&>
                    ((_Rb_tree<llvm::Value*,std::pair<llvm::Value*const,dg::DGParameterPair<dg::LLVMNode>>,std::_Select1st<std::pair<llvm::Value*const,dg::DGParameterPair<dg::LLVMNode>>>,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::DGParameterPair<dg::LLVMNode>>>>
                      *)C,&local_48);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pBVar2 = this->BBIn;
    (val_in->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).basicBlock = pBVar2;
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)val_in;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(pBVar2->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    pBVar2 = this->BBOut;
    (val_out->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).basicBlock = pBVar2;
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)val_out;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(pBVar2->nodes).super__List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return (bool)(pVar4.second & 1);
}

Assistant:

bool add(KeyT k, NodeT *val_in, NodeT *val_out, ContainerType *C) {
        auto v = std::make_pair(k, DGParameterPair<NodeT>(val_in, val_out));
        if (!C->insert(v).second)
            // we already has param with this key
            return false;

        BBIn->append(val_in);
        BBOut->append(val_out);

        return true;
    }